

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::doAtomicStore
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Address addr,Index bytes,Literal *toStore,
          Name memoryName,Address memorySize)

{
  ExternalInterface *pEVar1;
  char *pcVar2;
  undefined1 local_f8 [8];
  Const value;
  Const ptr;
  anon_union_16_6_1532cd5a_for_Literal_0 local_90;
  undefined8 local_80;
  undefined8 local_78;
  ulong uStack_70;
  undefined1 local_68;
  Type *local_60;
  undefined1 *local_58;
  uintptr_t local_50;
  size_t sStack_48;
  char *local_40;
  char *local_38;
  
  local_38 = memoryName.super_IString.str._M_str;
  checkAtomicAddress(this,addr,bytes,memorySize);
  value.value.type.id._0_1_ = 0xe;
  ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
  ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
  ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
  ptr.value.field_0.i64 = 0;
  ptr.value.field_0.func.super_IString.str._M_str = (char *)0x0;
  local_90.i32 = (int32_t)addr.addr;
  local_80 = 2;
  ::wasm::Literal::operator=
            ((Literal *)
             &ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,
             (Literal *)&local_90.func);
  ::wasm::Literal::~Literal((Literal *)&local_90.func);
  ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = IfId;
  ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
  local_f8[0] = 0xe;
  value.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
  value.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
  value.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
  value.value.field_0.i64 = 0;
  value.value.field_0.func.super_IString.str._M_str = (char *)0x0;
  ::wasm::Literal::operator=
            ((Literal *)
             &value.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,toStore
            );
  pcVar2 = local_38;
  value.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._0_8_ =
       (toStore->type).id;
  local_58 = local_f8;
  local_90.v128[0] = 0xd;
  local_90.func.super_IString.str._M_str = (char *)0x0;
  local_78 = 0;
  local_80 = CONCAT71(local_80._1_7_,(char)bytes);
  uStack_70 = (ulong)bytes;
  local_68 = 1;
  local_60 = &value.value.type;
  local_40 = local_38;
  pEVar1 = this->externalInterface;
  local_50 = value.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._0_8_;
  sStack_48 = memoryName.super_IString.str._M_len;
  ::wasm::Literal::Literal((Literal *)&ptr.value.type,toStore);
  (*pEVar1->_vptr_ExternalInterface[0xc])
            (pEVar1,&local_90,addr.addr,&ptr.value.type,memoryName.super_IString.str._M_len,pcVar2);
  ::wasm::Literal::~Literal((Literal *)&ptr.value.type);
  ::wasm::Literal::~Literal
            ((Literal *)
             &value.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type);
  ::wasm::Literal::~Literal
            ((Literal *)
             &ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type);
  return;
}

Assistant:

void doAtomicStore(Address addr,
                     Index bytes,
                     Literal toStore,
                     Name memoryName,
                     Address memorySize) {
    checkAtomicAddress(addr, bytes, memorySize);
    Const ptr;
    ptr.value = Literal(int32_t(addr));
    ptr.type = Type::i32;
    Const value;
    value.value = toStore;
    value.type = toStore.type;
    Store store;
    store.bytes = bytes;
    store.align = bytes;
    store.isAtomic = true; // understatement
    store.ptr = &ptr;
    store.value = &value;
    store.valueType = value.type;
    store.memory = memoryName;
    return externalInterface->store(&store, addr, toStore, memoryName);
  }